

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

void __thiscall crnlib::etc1_optimizer::params::clear_optimizer_params(params *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(int **)(in_RDI + 0x20) = clear_optimizer_params::s_default_scan_delta;
  *(undefined4 *)(in_RDI + 0x28) = 1;
  color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)(in_RDI + 0x2c));
  *(undefined1 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void clear_optimizer_params() {
      m_num_src_pixels = 0;
      m_pSrc_pixels = 0;

      m_use_color4 = false;
      static const int s_default_scan_delta[] = {0};
      m_pScan_deltas = s_default_scan_delta;
      m_scan_delta_size = 1;

      m_base_color5.clear();
      m_constrain_against_base_color5 = false;
    }